

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCDATASectionImpl.cpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::DOMCDATASectionImpl::getWholeText(DOMCDATASectionImpl *this)

{
  int iVar1;
  undefined4 extraout_var;
  DOMException *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMCDATASectionImpl *pDVar2;
  long *plVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar4;
  XMLSize_t XVar5;
  XMLCh *pXVar6;
  XMLCh *src;
  long *local_148;
  MemoryManager *local_110;
  DOMDocumentImpl *local_108;
  long local_f8;
  MemoryManager *local_e8;
  DOMCDATASectionImpl *local_e0;
  MemoryManager *local_d0;
  DOMDocumentImpl *local_c0;
  long local_b0;
  MemoryManager *local_a0;
  XMLCh *wholeString;
  DOMNode *nextNode;
  XMLBuffer buff;
  DOMNode *prevNode;
  DOMTreeWalker *pWalker;
  DOMNode *root;
  DOMDocument *doc;
  DOMCDATASectionImpl *this_local;
  
  iVar1 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
            _vptr_DOMNode[0xc])();
  local_148 = (long *)CONCAT44(extraout_var,iVar1);
  if (local_148 == (long *)0x0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this == (DOMCDATASectionImpl *)0x0) {
      local_a0 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar1 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                _vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_00,iVar1) == 0) {
        local_b0 = 0;
      }
      else {
        local_b0 = CONCAT44(extraout_var_00,iVar1) + -8;
      }
      if (local_b0 == 0) {
        local_d0 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar1 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                  _vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_01,iVar1) == 0) {
          local_c0 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_c0 = (DOMDocumentImpl *)(CONCAT44(extraout_var_01,iVar1) + -8);
        }
        local_d0 = DOMDocumentImpl::getMemoryManager(local_c0);
      }
      local_a0 = local_d0;
    }
    DOMException::DOMException(this_00,9,0,local_a0);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  pDVar2 = (DOMCDATASectionImpl *)(**(code **)(*local_148 + 0x68))();
  local_e0 = this;
  if (pDVar2 != (DOMCDATASectionImpl *)0x0) {
    local_e0 = pDVar2;
  }
  plVar3 = (long *)(**(code **)(local_148[2] + 0x18))(local_148 + 2,local_e0,0xffff,0,1);
  (**(code **)(*plVar3 + 0x70))(plVar3,this);
  do {
    buff.fBuffer = (XMLCh *)(**(code **)(*plVar3 + 0x60))();
    if (((buff.fBuffer == (XMLCh *)0x0) ||
        (iVar1 = (**(code **)(*(long *)buff.fBuffer + 0x20))(), iVar1 == 1)) ||
       (iVar1 = (**(code **)(*(long *)buff.fBuffer + 0x20))(), iVar1 == 8)) break;
    iVar1 = (**(code **)(*(long *)buff.fBuffer + 0x20))();
  } while (iVar1 != 7);
  if (this == (DOMCDATASectionImpl *)0x0) {
    local_e8 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    iVar1 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
              _vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var_02,iVar1) == 0) {
      local_f8 = 0;
    }
    else {
      local_f8 = CONCAT44(extraout_var_02,iVar1) + -8;
    }
    if (local_f8 == 0) {
      local_110 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar1 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                _vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_03,iVar1) == 0) {
        local_108 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_108 = (DOMDocumentImpl *)(CONCAT44(extraout_var_03,iVar1) + -8);
      }
      local_110 = DOMDocumentImpl::getMemoryManager(local_108);
    }
    local_e8 = local_110;
  }
  XMLBuffer::XMLBuffer((XMLBuffer *)&nextNode,0x3ff,local_e8);
  while (((plVar4 = (long *)(**(code **)(*plVar3 + 0x68))(), plVar4 != (long *)0x0 &&
          (iVar1 = (**(code **)(*plVar4 + 0x20))(), iVar1 != 1)) &&
         ((iVar1 = (**(code **)(*plVar4 + 0x20))(), iVar1 != 8 &&
          (iVar1 = (**(code **)(*plVar4 + 0x20))(), iVar1 != 7))))) {
    iVar1 = (**(code **)(*plVar4 + 0x20))();
    if ((iVar1 == 3) || (iVar1 = (**(code **)(*plVar4 + 0x20))(), iVar1 == 4)) {
      pXVar6 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
      XMLBuffer::append((XMLBuffer *)&nextNode,pXVar6);
    }
  }
  (**(code **)(*plVar3 + 0x78))();
  if (local_148 == (long *)0x0) {
    local_148 = (long *)0x0;
  }
  else {
    local_148 = local_148 + -1;
  }
  XVar5 = XMLBuffer::getLen((XMLBuffer *)&nextNode);
  pXVar6 = (XMLCh *)(**(code **)(*local_148 + 0x20))(local_148,XVar5 * 2 + 2);
  src = XMLBuffer::getRawBuffer((XMLBuffer *)&nextNode);
  XMLString::copyString(pXVar6,src);
  XMLBuffer::~XMLBuffer((XMLBuffer *)&nextNode);
  return pXVar6;
}

Assistant:

const XMLCh* DOMCDATASectionImpl::getWholeText() const
{
    DOMDocument *doc = getOwnerDocument();
    if (!doc) {
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, GetDOMNodeMemoryManager);
        return 0;
    }
    DOMNode* root=doc->getDocumentElement();
    DOMTreeWalker* pWalker=doc->createTreeWalker(root!=NULL?root:(DOMNode*)this, DOMNodeFilter::SHOW_ALL, NULL, true);
    pWalker->setCurrentNode((DOMNode*)this);
    // Logically-adjacent text nodes are Text or CDATASection nodes that can be visited sequentially in document order or in
    // reversed document order without entering, exiting, or passing over Element, Comment, or ProcessingInstruction nodes.
	DOMNode* prevNode;
    while((prevNode=pWalker->previousNode())!=NULL)
    {
        if(prevNode->getNodeType()==ELEMENT_NODE || prevNode->getNodeType()==COMMENT_NODE || prevNode->getNodeType()==PROCESSING_INSTRUCTION_NODE)
            break;
    }
	XMLBuffer buff(1023, GetDOMNodeMemoryManager);
	DOMNode* nextNode;
    while((nextNode=pWalker->nextNode())!=NULL)
    {
        if(nextNode->getNodeType()==ELEMENT_NODE || nextNode->getNodeType()==COMMENT_NODE || nextNode->getNodeType()==PROCESSING_INSTRUCTION_NODE)
            break;
        if(nextNode->getNodeType()==TEXT_NODE || nextNode->getNodeType()==CDATA_SECTION_NODE)
    		buff.append(nextNode->getNodeValue());
    }
    pWalker->release();

	XMLCh* wholeString = (XMLCh*)((DOMDocumentImpl*)doc)->allocate((buff.getLen()+1) * sizeof(XMLCh));
	XMLString::copyString(wholeString, buff.getRawBuffer());
	return wholeString;
}